

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalStreamingWindow::ExecuteShifted
          (PhysicalStreamingWindow *this,ExecutionContext *context,DataChunk *delayed,
          DataChunk *input,DataChunk *output,GlobalOperatorState *gstate_p,OperatorState *state_p)

{
  DataChunk *chunk;
  idx_t source_offset;
  idx_t source_count;
  idx_t source_count_00;
  reference pvVar1;
  reference pvVar2;
  idx_t col_idx;
  ulong __n;
  
  chunk = (DataChunk *)(state_p + 0x15);
  source_offset = output->count;
  source_count = input->count;
  source_count_00 = delayed->count;
  StreamingWindowState::Reset(chunk);
  DataChunk::Copy(delayed,chunk,0);
  StreamingWindowState::Reset(delayed);
  for (__n = 0; __n < (ulong)(((long)(delayed->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(delayed->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    pvVar1 = vector<duckdb::Vector,_true>::get<true>(&output->data,__n);
    pvVar2 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)chunk,__n);
    Vector::Reference(pvVar1,pvVar2);
    pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)chunk,__n);
    pvVar2 = vector<duckdb::Vector,_true>::get<true>(&delayed->data,__n);
    VectorOperations::Copy(pvVar1,pvVar2,source_count_00,source_offset,0);
    pvVar1 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
    pvVar2 = vector<duckdb::Vector,_true>::get<true>(&delayed->data,__n);
    VectorOperations::Copy(pvVar1,pvVar2,source_count,0,source_count_00 - source_offset);
  }
  delayed->count = (source_count - source_offset) + source_count_00;
  ExecuteFunctions(this,context,output,delayed,gstate_p,state_p);
  return;
}

Assistant:

void PhysicalStreamingWindow::ExecuteShifted(ExecutionContext &context, DataChunk &delayed, DataChunk &input,
                                             DataChunk &output, GlobalOperatorState &gstate_p,
                                             OperatorState &state_p) const {
	auto &state = state_p.Cast<StreamingWindowState>();
	auto &shifted = state.shifted;

	idx_t out = output.size();
	idx_t in = input.size();
	idx_t delay = delayed.size();
	D_ASSERT(out <= delay);

	state.Reset(shifted);
	// shifted = delayed
	delayed.Copy(shifted);
	state.Reset(delayed);
	for (idx_t col_idx = 0; col_idx < delayed.data.size(); ++col_idx) {
		// output[0:out] = delayed[0:out]
		output.data[col_idx].Reference(shifted.data[col_idx]);
		// delayed[0:out] = delayed[out:delay-out]
		VectorOperations::Copy(shifted.data[col_idx], delayed.data[col_idx], delay, out, 0);
		// delayed[delay-out:delay-out+in] = input[0:in]
		VectorOperations::Copy(input.data[col_idx], delayed.data[col_idx], in, 0, delay - out);
	}
	delayed.SetCardinality(delay - out + in);

	ExecuteFunctions(context, output, delayed, gstate_p, state_p);
}